

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * Catch::clara::detail::convertInto(string *source,string *target)

{
  string *in_RDX;
  string *in_RSI;
  ParserResult *in_RDI;
  ParseResultType *in_stack_ffffffffffffffc8;
  
  ::std::__cxx11::string::operator=(in_RDX,in_RSI);
  BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
            (in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

inline auto convertInto( std::string const &source, std::string& target ) -> ParserResult {
        target = source;
        return ParserResult::ok( ParseResultType::Matched );
    }